

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cpp
# Opt level: O2

void __thiscall buffer::shrink(buffer *this)

{
  if (*(int *)&this->end_ == *(int *)&this->begin_) {
    if (this->buffer_ != (char *)0x0) {
      free(this->buffer_);
      this->begin_ = (char *)0x0;
      this->end_ = (char *)0x0;
      *(undefined8 *)&this->capacity_ = 0;
      *(undefined8 *)((long)&this->buffer_ + 4) = 0;
    }
    return;
  }
  __assert_fail("false",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jinjiazhang[P]protonet/protonet/buffer.cpp"
                ,99,"void buffer::shrink()");
}

Assistant:

void buffer::shrink()
{
    int used = end_ - begin_;
    if (used == 0)
    {
        if (buffer_)
        {
            free(buffer_);
            buffer_ = NULL;
            begin_ = NULL;
            end_ = NULL;
            capacity_ = 0;
        }
        return;
    }

    assert(false); // todo
}